

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

double Cudd_CountMinterm(DdManager *manager,DdNode *node,int nvars)

{
  DdHashTable *table;
  double dVar1;
  double ep;
  
  background = manager->background;
  zero = (DdNode *)((ulong)manager->one ^ 1);
  dVar1 = ldexp(1.0,nvars);
  table = cuddHashTableInit(manager,1,2);
  if (table == (DdHashTable *)0x0) {
    dVar1 = -1.0;
  }
  else {
    ep = Cudd_ReadEpsilon(manager);
    Cudd_SetEpsilon(manager,0.0);
    dVar1 = ddCountMintermAux(node,dVar1,table);
    cuddHashTableQuit(table);
    Cudd_SetEpsilon(manager,ep);
  }
  return dVar1;
}

Assistant:

double
Cudd_CountMinterm(
  DdManager * manager,
  DdNode * node,
  int  nvars)
{
    double      max;
    DdHashTable *table;
    double      res;
    CUDD_VALUE_TYPE epsilon;

    background = manager->background;
    zero = Cudd_Not(manager->one);

    max = pow(2.0,(double)nvars);
    table = cuddHashTableInit(manager,1,2);
    if (table == NULL) {
        return((double)CUDD_OUT_OF_MEM);
    }
    epsilon = Cudd_ReadEpsilon(manager);
    Cudd_SetEpsilon(manager,(CUDD_VALUE_TYPE)0.0);
    res = ddCountMintermAux(node,max,table);
    cuddHashTableQuit(table);
    Cudd_SetEpsilon(manager,epsilon);

    return(res);

}